

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall Context<false>::PopNamespace(Context<false> *this)

{
  Namespace<false> *__first;
  uchar **ppuVar1;
  reference pvVar2;
  long in_RDI;
  BaseState<false> *return_state;
  char feature_group;
  Namespace<false> *ns;
  uchar *new_ele;
  v_array<unsigned_char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffe0;
  BaseState<false> *pBVar3;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  char cVar4;
  
  __first = CurrentNamespace((Context<false> *)0x27d0e8);
  if (__first->feature_count != 0) {
    cVar4 = __first->feature_group;
    ppuVar1 = v_array<unsigned_char>::begin(*(v_array<unsigned_char> **)(in_RDI + 0x50));
    new_ele = *ppuVar1;
    v_array<unsigned_char>::end(*(v_array<unsigned_char> **)(in_RDI + 0x50));
    in_stack_ffffffffffffffd0 =
         (v_array<unsigned_char> *)
         std::find<unsigned_char*,char>
                   ((uchar *)__first,
                    (uchar *)CONCAT17(cVar4,CONCAT16(in_stack_ffffffffffffffee,
                                                     in_stack_ffffffffffffffe8)),
                    in_stack_ffffffffffffffe0);
    ppuVar1 = v_array<unsigned_char>::end(*(v_array<unsigned_char> **)(in_RDI + 0x50));
    if (in_stack_ffffffffffffffd0 == (v_array<unsigned_char> *)*ppuVar1) {
      v_array<unsigned_char>::push_back(in_stack_ffffffffffffffd0,new_ele);
    }
  }
  pvVar2 = std::vector<Namespace<false>,_std::allocator<Namespace<false>_>_>::back
                     ((vector<Namespace<false>,_std::allocator<Namespace<false>_>_> *)
                      in_stack_ffffffffffffffd0);
  pBVar3 = pvVar2->return_state;
  std::vector<Namespace<false>,_std::allocator<Namespace<false>_>_>::pop_back
            ((vector<Namespace<false>,_std::allocator<Namespace<false>_>_> *)0x27d1a4);
  return pBVar3;
}

Assistant:

BaseState<audit>* PopNamespace()
  {
    auto& ns = CurrentNamespace();
    if (ns.feature_count > 0)
    {
      auto feature_group = ns.feature_group;
      // Do not insert feature_group if it already exists.
      if(std::find(ex->indices.begin(), ex->indices.end(), feature_group) == ex->indices.end())
      {
        ex->indices.push_back(feature_group);
      }
    }

    auto return_state = namespace_path.back().return_state;
    namespace_path.pop_back();
    return return_state;
  }